

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_110eb68::HandleLockCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  string *in_base;
  Status SVar5;
  FILE *__stream;
  cmGlobalGenerator *pcVar6;
  bool bVar7;
  pointer pbVar8;
  pointer pcVar9;
  uint uVar10;
  ulong uVar11;
  _Alloc_hider timeoutSec;
  cmFileLockPool *this;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  cmFileLockResult fileLockResult;
  string path;
  string resultVariable;
  string parentDir;
  string result;
  int local_15c;
  cmFileLockResult local_148;
  string local_140;
  undefined1 local_120 [48];
  undefined1 local_f0 [24];
  char *local_d8;
  size_type local_d0;
  char *local_c8;
  undefined8 local_c0;
  char *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x21) {
    pcVar1 = status->Makefile;
    local_f0._0_8_ = local_f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"sub-command LOCK requires at least two arguments.","");
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_f0);
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
    }
    bVar3 = false;
    goto LAB_0035a88d;
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  pcVar9 = pbVar8[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,pcVar9,pcVar9 + pbVar8[1]._M_string_length);
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x41) {
    timeoutSec._M_p = (pointer)0xffffffffffffffff;
    local_15c = 2;
    bVar3 = false;
  }
  else {
    timeoutSec._M_p = (pointer)0xffffffffffffffff;
    local_15c = 2;
    bVar7 = false;
    bVar3 = false;
    uVar11 = 2;
    do {
      uVar10 = (uint)uVar11;
      iVar4 = std::__cxx11::string::compare((char *)(pbVar8 + uVar11));
      if (iVar4 == 0) {
        bVar7 = true;
      }
      else {
        iVar4 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar11));
        if (iVar4 == 0) {
          bVar3 = true;
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar11));
          if (iVar4 == 0) {
            uVar10 = uVar10 + 1;
            uVar11 = (ulong)uVar10;
            pbVar8 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5) <=
                uVar11) {
              pcVar1 = status->Makefile;
              local_f0._0_8_ = local_f0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_f0,"expected FUNCTION, FILE or PROCESS after GUARD","");
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_f0);
LAB_0035a7b7:
              local_120._16_8_ = local_f0._16_8_;
              pcVar9 = (pointer)local_f0._0_8_;
              if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) goto LAB_0035a86c;
              goto LAB_0035a874;
            }
            iVar4 = std::__cxx11::string::compare((char *)(pbVar8 + uVar11));
            if (iVar4 == 0) {
              local_15c = 0;
            }
            else {
              iVar4 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar11));
              if (iVar4 == 0) {
                local_15c = 1;
              }
              else {
                iVar4 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar11));
                local_15c = 2;
                if (iVar4 != 0) {
                  pcVar1 = status->Makefile;
                  pbVar8 = (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  local_f0._0_8_ = &DAT_0000002e;
                  local_f0._8_8_ = "expected FUNCTION, FILE or PROCESS after GUARD";
                  local_f0._16_8_ = (pointer)0xe;
                  local_d8 = ", but got:\n  \"";
                  local_c8 = pbVar8[uVar11]._M_dataplus._M_p;
                  local_d0 = pbVar8[uVar11]._M_string_length;
                  local_c0 = 2;
                  local_b8 = "\".";
                  views_03._M_len = 4;
                  views_03._M_array = (iterator)local_f0;
                  cmCatViews_abi_cxx11_((string *)local_120,views_03);
                  cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_120);
                  goto LAB_0035a859;
                }
              }
            }
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar11));
            if (iVar4 != 0) {
              iVar4 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar11));
              if (iVar4 == 0) {
                uVar10 = uVar10 + 1;
                uVar11 = (ulong)uVar10;
                pbVar8 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if ((ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)
                    <= uVar11) {
                  pcVar1 = status->Makefile;
                  local_f0._0_8_ = local_f0 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_f0,"expected timeout value after TIMEOUT","");
                  cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_f0);
                  goto LAB_0035a7b7;
                }
                bVar2 = cmStrToLong(pbVar8 + uVar11,(long *)&local_90);
                timeoutSec._M_p = local_90._M_dataplus._M_p;
                if (bVar2 && -1 < (long)local_90._M_dataplus._M_p) goto LAB_0035a1fb;
                pcVar1 = status->Makefile;
                pbVar8 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_d8 = pbVar8[uVar11]._M_dataplus._M_p;
                local_f0._16_8_ = pbVar8[uVar11]._M_string_length;
                local_f0._0_8_ = (pointer)0xf;
                local_f0._8_8_ = "TIMEOUT value \"";
                local_d0 = 0x1d;
                local_c8 = "\" is not an unsigned integer.";
                views_02._M_len = 3;
                views_02._M_array = (iterator)local_f0;
                cmCatViews_abi_cxx11_((string *)local_120,views_02);
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_120);
              }
              else {
                pcVar1 = status->Makefile;
                pbVar8 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_f0._0_8_ = (pointer)0x37;
                local_f0._8_8_ = "expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or ";
                local_f0._16_8_ = (pointer)0x12;
                local_d8 = "TIMEOUT\nbut got: \"";
                local_c8 = pbVar8[uVar11]._M_dataplus._M_p;
                local_d0 = pbVar8[uVar11]._M_string_length;
                local_c0 = 2;
                local_b8 = "\".";
                views_01._M_len = 4;
                views_01._M_array = (iterator)local_f0;
                cmCatViews_abi_cxx11_((string *)local_120,views_01);
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_120);
              }
LAB_0035a859:
              pcVar9 = (pointer)local_120._0_8_;
              if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
LAB_0035a86c:
                operator_delete(pcVar9,(ulong)(local_120._16_8_ + 1));
              }
LAB_0035a874:
              bVar3 = false;
              goto LAB_0035a876;
            }
            uVar10 = uVar10 + 1;
            if ((ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar10) {
              pcVar1 = status->Makefile;
              local_f0._0_8_ = local_f0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_f0,"expected variable name after RESULT_VARIABLE","");
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_f0);
              goto LAB_0035a7b7;
            }
            std::__cxx11::string::_M_assign((string *)&local_b0);
          }
        }
      }
LAB_0035a1fb:
      uVar11 = (ulong)(uVar10 + 1);
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)
            );
    if (bVar7) {
      std::__cxx11::string::append((char *)&local_140);
    }
  }
  in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
  cmsys::SystemTools::CollapseFullPath((string *)local_f0,&local_140,in_base);
  std::__cxx11::string::operator=((string *)&local_140,(string *)local_f0);
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
  }
  cmsys::SystemTools::GetParentDirectory(&local_90,&local_140);
  SVar5 = cmsys::SystemTools::MakeDirectory(&local_90,(mode_t *)0x0);
  if (SVar5.Kind_ == Success) {
    __stream = (FILE *)cmsys::SystemTools::Fopen(&local_140,"w");
    if (__stream == (FILE *)0x0) {
      pcVar1 = status->Makefile;
      local_f0._0_8_ = (pointer)0x8;
      local_f0._8_8_ = "file\n  \"";
      local_f0._16_8_ = local_140._M_string_length;
      local_d8 = local_140._M_dataplus._M_p;
      local_d0 = 0x26;
      local_c8 = "\"\ncreation failed (check permissions).";
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_f0;
      cmCatViews_abi_cxx11_((string *)local_120,views_00);
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_120);
      goto LAB_0035a34a;
    }
    fclose(__stream);
    pcVar6 = cmMakefile::GetGlobalGenerator(status->Makefile);
    local_148 = cmFileLockResult::MakeOk();
    this = &pcVar6->FileLockPool;
    if (bVar3) {
      local_148 = cmFileLockPool::Release(this,&local_140);
    }
    else if (local_15c == 2) {
      local_148 = cmFileLockPool::LockProcessScope(this,&local_140,(unsigned_long)timeoutSec._M_p);
    }
    else if (local_15c == 1) {
      local_148 = cmFileLockPool::LockFileScope(this,&local_140,(unsigned_long)timeoutSec._M_p);
    }
    else {
      local_148 = cmFileLockPool::LockFunctionScope(this,&local_140,(unsigned_long)timeoutSec._M_p);
    }
    cmFileLockResult::GetOutputMessage_abi_cxx11_(&local_70,&local_148);
    if (local_b0._M_string_length == 0) {
      bVar3 = cmFileLockResult::IsOk(&local_148);
      if (bVar3) {
        if (local_b0._M_string_length != 0) goto LAB_0035a666;
        bVar3 = true;
      }
      else {
        pcVar1 = status->Makefile;
        local_f0._0_8_ = (pointer)0x16;
        local_f0._8_8_ = "error locking file\n  \"";
        local_120._0_8_ = local_140._M_string_length;
        local_120._8_8_ = local_140._M_dataplus._M_p;
        cmStrCat<char[3],std::__cxx11::string,char[2]>
                  (&local_50,(cmAlphaNum *)local_f0,(cmAlphaNum *)local_120,(char (*) [3])0x78b549,
                   &local_70,(char (*) [2])0x755914);
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        cmSystemTools::s_FatalErrorOccurred = true;
        bVar3 = false;
      }
    }
    else {
LAB_0035a666:
      bVar3 = true;
      value._M_str = local_70._M_dataplus._M_p;
      value._M_len = local_70._M_string_length;
      cmMakefile::AddDefinition(status->Makefile,&local_b0,value);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar1 = status->Makefile;
    local_f0._0_8_ = (pointer)0xd;
    local_f0._8_8_ = "directory\n  \"";
    local_f0._16_8_ = local_90._M_string_length;
    local_d8 = local_90._M_dataplus._M_p;
    local_d0 = 0x26;
    local_c8 = "\"\ncreation failed (check permissions).";
    views._M_len = 3;
    views._M_array = (iterator)local_f0;
    cmCatViews_abi_cxx11_((string *)local_120,views);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_120);
LAB_0035a34a:
    if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
      operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
    }
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar3 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
LAB_0035a876:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
LAB_0035a88d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool HandleLockCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)
  // Default values
  bool directory = false;
  bool release = false;
  enum Guard
  {
    GUARD_FUNCTION,
    GUARD_FILE,
    GUARD_PROCESS
  };
  Guard guard = GUARD_PROCESS;
  std::string resultVariable;
  unsigned long timeout = static_cast<unsigned long>(-1);

  // Parse arguments
  if (args.size() < 2) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      "sub-command LOCK requires at least two arguments.");
    return false;
  }

  std::string path = args[1];
  for (unsigned i = 2; i < args.size(); ++i) {
    if (args[i] == "DIRECTORY") {
      directory = true;
    } else if (args[i] == "RELEASE") {
      release = true;
    } else if (args[i] == "GUARD") {
      ++i;
      const char* merr = "expected FUNCTION, FILE or PROCESS after GUARD";
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(MessageType::FATAL_ERROR, merr);
        return false;
      }
      if (args[i] == "FUNCTION") {
        guard = GUARD_FUNCTION;
      } else if (args[i] == "FILE") {
        guard = GUARD_FILE;
      } else if (args[i] == "PROCESS") {
        guard = GUARD_PROCESS;
      } else {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat(merr, ", but got:\n  \"", args[i], "\"."));
        return false;
      }

    } else if (args[i] == "RESULT_VARIABLE") {
      ++i;
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          "expected variable name after RESULT_VARIABLE");
        return false;
      }
      resultVariable = args[i];
    } else if (args[i] == "TIMEOUT") {
      ++i;
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR, "expected timeout value after TIMEOUT");
        return false;
      }
      long scanned;
      if (!cmStrToLong(args[i], &scanned) || scanned < 0) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("TIMEOUT value \"", args[i],
                   "\" is not an unsigned integer."));
        return false;
      }
      timeout = static_cast<unsigned long>(scanned);
    } else {
      status.GetMakefile().IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or ",
                 "TIMEOUT\nbut got: \"", args[i], "\"."));
      return false;
    }
  }

  if (directory) {
    path += "/cmake.lock";
  }

  // Unify path (remove '//', '/../', ...)
  path = cmSystemTools::CollapseFullPath(
    path, status.GetMakefile().GetCurrentSourceDirectory());

  // Create file and directories if needed
  std::string parentDir = cmSystemTools::GetParentDirectory(path);
  if (!cmSystemTools::MakeDirectory(parentDir)) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("directory\n  \"", parentDir,
               "\"\ncreation failed (check permissions)."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  FILE* file = cmsys::SystemTools::Fopen(path, "w");
  if (!file) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("file\n  \"", path,
               "\"\ncreation failed (check permissions)."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  fclose(file);

  // Actual lock/unlock
  cmFileLockPool& lockPool =
    status.GetMakefile().GetGlobalGenerator()->GetFileLockPool();

  cmFileLockResult fileLockResult(cmFileLockResult::MakeOk());
  if (release) {
    fileLockResult = lockPool.Release(path);
  } else {
    switch (guard) {
      case GUARD_FUNCTION:
        fileLockResult = lockPool.LockFunctionScope(path, timeout);
        break;
      case GUARD_FILE:
        fileLockResult = lockPool.LockFileScope(path, timeout);
        break;
      case GUARD_PROCESS:
        fileLockResult = lockPool.LockProcessScope(path, timeout);
        break;
      default:
        cmSystemTools::SetFatalErrorOccurred();
        return false;
    }
  }

  const std::string result = fileLockResult.GetOutputMessage();

  if (resultVariable.empty() && !fileLockResult.IsOk()) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("error locking file\n  \"", path, "\"\n", result, "."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (!resultVariable.empty()) {
    status.GetMakefile().AddDefinition(resultVariable, result);
  }

  return true;
#else
  static_cast<void>(args);
  status.SetError("sub-command LOCK not implemented in bootstrap cmake");
  return false;
#endif
}